

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O1

bool __thiscall TCLAP::Arg::operator==(Arg *this,Arg *a)

{
  size_t sVar1;
  int iVar2;
  bool bVar3;
  
  iVar2 = std::__cxx11::string::compare((char *)&this->_flag);
  if ((iVar2 != 0) && (sVar1 = (this->_flag)._M_string_length, sVar1 == (a->_flag)._M_string_length)
     ) {
    if (sVar1 == 0) {
      return true;
    }
    iVar2 = bcmp((this->_flag)._M_dataplus._M_p,(a->_flag)._M_dataplus._M_p,sVar1);
    if (iVar2 == 0) {
      return true;
    }
  }
  sVar1 = (this->_name)._M_string_length;
  if (sVar1 == (a->_name)._M_string_length) {
    if (sVar1 == 0) {
      bVar3 = true;
    }
    else {
      iVar2 = bcmp((this->_name)._M_dataplus._M_p,(a->_name)._M_dataplus._M_p,sVar1);
      bVar3 = iVar2 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

inline bool Arg::operator==(const Arg& a) const
{
	if ( ( _flag != "" && _flag == a._flag ) || _name == a._name)
		return true;
	else
		return false;
}